

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

NaReal __thiscall NaVector::average(NaVector *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  NaReal NVar4;
  double local_18;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  NVar4 = 0.0;
  if (iVar1 != 0) {
    local_18 = 0.0;
    uVar3 = 0;
    while( true ) {
      uVar2 = (*this->_vptr_NaVector[6])(this);
      if (uVar2 <= uVar3) break;
      local_18 = local_18 + this->pVect[uVar3];
      uVar3 = uVar3 + 1;
    }
    uVar2 = (*this->_vptr_NaVector[6])(this);
    NVar4 = local_18 / (double)uVar2;
  }
  return NVar4;
}

Assistant:

NaReal
NaVector::average () const
{
    if(0 == dim())
        return 0.0;

    NaReal      sum = 0.0;
    unsigned    i;
    for(i = 0; i < dim(); ++i){
        sum += pVect[i];
    }
    return sum / dim();
}